

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O0

size_t flvtag_header_size(flvtag_t *tag)

{
  flvtag_type_t fVar1;
  flvtag_soundformat_t fVar2;
  int iVar3;
  flvtag_codecid_t fVar4;
  flvtag_frametype_t fVar5;
  undefined4 local_20;
  flvtag_t *tag_local;
  
  fVar1 = flvtag_type(tag);
  if (fVar1 == flvtag_type_audio) {
    fVar2 = flvtag_soundformat(tag);
    iVar3 = 2;
    if (fVar2 != flvtag_soundformat_aac) {
      iVar3 = 1;
    }
    tag_local = (flvtag_t *)(long)(iVar3 + 0xb);
  }
  else if (fVar1 == flvtag_type_video) {
    fVar4 = flvtag_codecid(tag);
    if (fVar4 == flvtag_codecid_avc) {
      fVar5 = flvtag_frametype(tag);
      local_20 = 2;
      if (fVar5 != flvtag_frametype_commandframe) {
        local_20 = 5;
      }
    }
    else {
      local_20 = 1;
    }
    tag_local = (flvtag_t *)(long)(local_20 + 0xb);
  }
  else {
    tag_local = (flvtag_t *)0xb;
  }
  return (size_t)tag_local;
}

Assistant:

size_t flvtag_header_size(flvtag_t* tag)
{
    switch (flvtag_type(tag)) {
    case flvtag_type_audio:
        return FLV_TAG_HEADER_SIZE + (flvtag_soundformat_aac != flvtag_soundformat(tag) ? 1 : 2);

    case flvtag_type_video:
        // CommandFrame does not have a compositionTime
        return FLV_TAG_HEADER_SIZE + (flvtag_codecid_avc != flvtag_codecid(tag) ? 1 : (flvtag_frametype_commandframe != flvtag_frametype(tag) ? 5 : 2));

    default:
        return FLV_TAG_HEADER_SIZE;
    }
}